

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O2

IssuanceParameter * __thiscall
cfd::core::ConfidentialTransaction::SetAssetIssuance
          (IssuanceParameter *__return_storage_ptr__,ConfidentialTransaction *this,
          uint32_t tx_in_index,Amount *asset_amount,
          vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_> *asset_output_amount_list,
          vector<cfd::core::Script,_std::allocator<cfd::core::Script>_> *asset_locking_script_list,
          vector<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_>
          *asset_nonce_list,Amount *token_amount,
          vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_> *token_output_amount_list,
          vector<cfd::core::Script,_std::allocator<cfd::core::Script>_> *token_locking_script_list,
          vector<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_>
          *token_nonce_list,bool is_blind,ByteData256 *contract_hash)

{
  pointer pAVar1;
  Script *pSVar2;
  Amount *pAVar3;
  pointer pCVar4;
  ByteData issuance_amount_rangeproof;
  ByteData inflation_keys_rangeproof;
  bool bVar5;
  uint32_t vout;
  size_t sVar6;
  int64_t iVar7;
  CfdException *pCVar8;
  Script *pSVar9;
  long lVar10;
  size_t index_1;
  long lVar11;
  Amount *amount;
  pointer pAVar12;
  Amount *amount_00;
  long lVar13;
  size_t index;
  ulong uVar14;
  pointer in_stack_fffffffffffffe78;
  ConfidentialNonce nonce;
  vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_> *__range3;
  Amount total;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_110;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_f8;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_e0;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_c8;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_b0;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_98;
  ConfidentialValue local_80;
  ConfidentialValue local_58;
  
  (*(this->super_AbstractTransaction)._vptr_AbstractTransaction[0xb])
            (this,(ulong)tx_in_index,0x750,"SetAssetIssuance");
  ConfidentialValue::ConfidentialValue
            ((ConfidentialValue *)&nonce,
             &(this->vin_).
              super__Vector_base<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_>
              ._M_impl.super__Vector_impl_data._M_start[tx_in_index].inflation_keys_);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_110,&nonce.data_.data_)
  ;
  sVar6 = ByteData::GetDataSize((ByteData *)&local_110);
  if (sVar6 == 0) {
    ConfidentialValue::ConfidentialValue
              ((ConfidentialValue *)&total,
               &(this->vin_).
                super__Vector_base<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_>
                ._M_impl.super__Vector_impl_data._M_start[tx_in_index].issuance_amount_);
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_c8,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&total.ignore_check_);
    sVar6 = ByteData::GetDataSize((ByteData *)&local_c8);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_c8);
    ConfidentialValue::~ConfidentialValue((ConfidentialValue *)&total);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_110);
    ConfidentialValue::~ConfidentialValue((ConfidentialValue *)&nonce);
    if (sVar6 == 0) {
      iVar7 = Amount::GetSatoshiValue(asset_amount);
      if (iVar7 < 1) {
        iVar7 = Amount::GetSatoshiValue(token_amount);
        if (iVar7 < 1) {
          nonce._vptr_ConfidentialNonce = (_func_int **)0x4f4893;
          nonce.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start._0_4_ = 0x75a;
          nonce.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_finish = "SetAssetIssuance";
          logger::warn<>((CfdSourceLocation *)&nonce,"Issuance must have one non-zero amount.");
          pCVar8 = (CfdException *)__cxa_allocate_exception(0x30);
          ::std::__cxx11::string::string
                    ((string *)&nonce,"Issuance must have one non-zero amount.",(allocator *)&total)
          ;
          CfdException::CfdException(pCVar8,kCfdIllegalArgumentError,(string *)&nonce);
          __cxa_throw(pCVar8,&CfdException::typeinfo,CfdException::~CfdException);
        }
      }
      pAVar12 = (asset_output_amount_list->
                super__Vector_base<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>)._M_impl.
                super__Vector_impl_data._M_start;
      pAVar1 = (asset_output_amount_list->
               super__Vector_base<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      if ((pAVar12 == pAVar1) ==
          ((asset_locking_script_list->
           super__Vector_base<cfd::core::Script,_std::allocator<cfd::core::Script>_>)._M_impl.
           super__Vector_impl_data._M_start ==
          (asset_locking_script_list->
          super__Vector_base<cfd::core::Script,_std::allocator<cfd::core::Script>_>)._M_impl.
          super__Vector_impl_data._M_finish)) {
        if (pAVar12 != pAVar1) {
          Amount::Amount(&total);
          pAVar1 = (asset_output_amount_list->
                   super__Vector_base<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>).
                   _M_impl.super__Vector_impl_data._M_finish;
          for (pAVar12 = (asset_output_amount_list->
                         super__Vector_base<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>).
                         _M_impl.super__Vector_impl_data._M_start; pAVar12 != pAVar1;
              pAVar12 = pAVar12 + 1) {
            Amount::operator+=(&total,pAVar12);
          }
          bVar5 = Amount::operator!=(&total,asset_amount);
          if (bVar5) {
            nonce._vptr_ConfidentialNonce = (_func_int **)0x4f4893;
            nonce.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start._0_4_ = 0x76c;
            nonce.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_finish = "SetAssetIssuance";
            logger::warn<>((CfdSourceLocation *)&nonce,"Unmatch asset amount.");
            pCVar8 = (CfdException *)__cxa_allocate_exception(0x30);
            ::std::__cxx11::string::string
                      ((string *)&nonce,"Unmatch asset amount.",(allocator *)&local_110);
            CfdException::CfdException(pCVar8,kCfdIllegalArgumentError,(string *)&nonce);
            __cxa_throw(pCVar8,&CfdException::typeinfo,CfdException::~CfdException);
          }
          pSVar9 = (asset_locking_script_list->
                   super__Vector_base<cfd::core::Script,_std::allocator<cfd::core::Script>_>).
                   _M_impl.super__Vector_impl_data._M_start;
          pSVar2 = (asset_locking_script_list->
                   super__Vector_base<cfd::core::Script,_std::allocator<cfd::core::Script>_>).
                   _M_impl.super__Vector_impl_data._M_finish;
          while (pSVar9 != pSVar2) {
            bVar5 = Script::IsEmpty(pSVar9);
            pSVar9 = pSVar9 + 1;
            if (bVar5) {
              nonce._vptr_ConfidentialNonce = (_func_int **)0x4f4893;
              nonce.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_start._0_4_ = 0x771;
              nonce.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_finish = "SetAssetIssuance";
              logger::warn<>((CfdSourceLocation *)&nonce,"Empty locking script from asset.");
              pCVar8 = (CfdException *)__cxa_allocate_exception(0x30);
              ::std::__cxx11::string::string
                        ((string *)&nonce,"Empty locking script from asset.",(allocator *)&local_110
                        );
              CfdException::CfdException(pCVar8,kCfdIllegalArgumentError,(string *)&nonce);
              __cxa_throw(pCVar8,&CfdException::typeinfo,CfdException::~CfdException);
            }
          }
        }
        pAVar12 = (token_output_amount_list->
                  super__Vector_base<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>)._M_impl
                  .super__Vector_impl_data._M_start;
        pAVar1 = (token_output_amount_list->
                 super__Vector_base<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
        if ((pAVar12 == pAVar1) !=
            ((token_locking_script_list->
             super__Vector_base<cfd::core::Script,_std::allocator<cfd::core::Script>_>)._M_impl.
             super__Vector_impl_data._M_start ==
            (token_locking_script_list->
            super__Vector_base<cfd::core::Script,_std::allocator<cfd::core::Script>_>)._M_impl.
            super__Vector_impl_data._M_finish)) {
          nonce._vptr_ConfidentialNonce = (_func_int **)0x4f4893;
          nonce.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start._0_4_ = 0x779;
          nonce.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_finish = "SetAssetIssuance";
          logger::warn<>((CfdSourceLocation *)&nonce,
                         "Unmatch count. token amount list and locking script list.");
          pCVar8 = (CfdException *)__cxa_allocate_exception(0x30);
          ::std::__cxx11::string::string
                    ((string *)&nonce,"Unmatch count. token amount list and locking script list.",
                     (allocator *)&total);
          CfdException::CfdException(pCVar8,kCfdIllegalArgumentError,(string *)&nonce);
          __cxa_throw(pCVar8,&CfdException::typeinfo,CfdException::~CfdException);
        }
        if (pAVar12 != pAVar1) {
          Amount::Amount(&total);
          pAVar3 = (token_output_amount_list->
                   super__Vector_base<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>).
                   _M_impl.super__Vector_impl_data._M_finish;
          for (amount_00 = (token_output_amount_list->
                           super__Vector_base<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>
                           )._M_impl.super__Vector_impl_data._M_start; amount_00 != pAVar3;
              amount_00 = amount_00 + 1) {
            Amount::operator+=(&total,amount_00);
          }
          bVar5 = Amount::operator!=(&total,token_amount);
          if (bVar5) {
            nonce._vptr_ConfidentialNonce = (_func_int **)0x4f4893;
            nonce.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start._0_4_ = 0x785;
            nonce.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_finish = "SetAssetIssuance";
            logger::warn<>((CfdSourceLocation *)&nonce,"Unmatch token amount.");
            pCVar8 = (CfdException *)__cxa_allocate_exception(0x30);
            ::std::__cxx11::string::string
                      ((string *)&nonce,"Unmatch token amount.",(allocator *)&local_110);
            CfdException::CfdException(pCVar8,kCfdIllegalArgumentError,(string *)&nonce);
            __cxa_throw(pCVar8,&CfdException::typeinfo,CfdException::~CfdException);
          }
          pSVar9 = (token_locking_script_list->
                   super__Vector_base<cfd::core::Script,_std::allocator<cfd::core::Script>_>).
                   _M_impl.super__Vector_impl_data._M_start;
          pSVar2 = (token_locking_script_list->
                   super__Vector_base<cfd::core::Script,_std::allocator<cfd::core::Script>_>).
                   _M_impl.super__Vector_impl_data._M_finish;
          while (pSVar9 != pSVar2) {
            bVar5 = Script::IsEmpty(pSVar9);
            pSVar9 = pSVar9 + 1;
            if (bVar5) {
              nonce._vptr_ConfidentialNonce = (_func_int **)0x4f4893;
              nonce.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_start._0_4_ = 0x78a;
              nonce.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_finish = "SetAssetIssuance";
              logger::warn<>((CfdSourceLocation *)&nonce,"Empty locking script from token.");
              pCVar8 = (CfdException *)__cxa_allocate_exception(0x30);
              ::std::__cxx11::string::string
                        ((string *)&nonce,"Empty locking script from token.",(allocator *)&local_110
                        );
              CfdException::CfdException(pCVar8,kCfdIllegalArgumentError,(string *)&nonce);
              __cxa_throw(pCVar8,&CfdException::typeinfo,CfdException::~CfdException);
            }
          }
        }
        AbstractTxIn::GetTxid
                  ((Txid *)&nonce,
                   &(this->vin_).
                    super__Vector_base<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_>
                    ._M_impl.super__Vector_impl_data._M_start[tx_in_index].super_AbstractTxIn);
        vout = AbstractTxIn::GetVout
                         (&(this->vin_).
                           super__Vector_base<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_>
                           ._M_impl.super__Vector_impl_data._M_start[tx_in_index].super_AbstractTxIn
                         );
        ByteData256::ByteData256((ByteData256 *)&total);
        CalculateIssuanceValue
                  (__return_storage_ptr__,(Txid *)&nonce,vout,is_blind,contract_hash,
                   (ByteData256 *)&total);
        ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&total);
        Txid::~Txid((Txid *)&nonce);
        ByteData256::ByteData256((ByteData256 *)&local_e0);
        ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_f8,
                   &contract_hash->data_);
        ConfidentialValue::ConfidentialValue(&local_58,asset_amount);
        ConfidentialValue::ConfidentialValue(&local_80,token_amount);
        ByteData::ByteData((ByteData *)&local_98);
        ByteData::ByteData((ByteData *)&local_b0);
        issuance_amount_rangeproof.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)&local_b0;
        issuance_amount_rangeproof.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)&local_98;
        issuance_amount_rangeproof.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = in_stack_fffffffffffffe78;
        inflation_keys_rangeproof.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish._0_4_ =
             nonce.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start._0_4_;
        inflation_keys_rangeproof.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)nonce._vptr_ConfidentialNonce;
        inflation_keys_rangeproof.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish._4_4_ =
             nonce.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start._4_4_;
        inflation_keys_rangeproof.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             nonce.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        SetIssuance(this,tx_in_index,(ByteData256 *)&local_e0,(ByteData256 *)&local_f8,&local_58,
                    &local_80,issuance_amount_rangeproof,inflation_keys_rangeproof);
        ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_b0)
        ;
        ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_98)
        ;
        ConfidentialValue::~ConfidentialValue(&local_80);
        ConfidentialValue::~ConfidentialValue(&local_58);
        ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_f8)
        ;
        ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_e0)
        ;
        if ((asset_output_amount_list->
            super__Vector_base<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>)._M_impl.
            super__Vector_impl_data._M_start !=
            (asset_output_amount_list->
            super__Vector_base<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>)._M_impl.
            super__Vector_impl_data._M_finish) {
          iVar7 = Amount::GetSatoshiValue(asset_amount);
          if (0 < iVar7) {
            lVar13 = 0;
            lVar10 = 0;
            lVar11 = 0;
            for (uVar14 = 0;
                uVar14 < (ulong)((long)(asset_output_amount_list->
                                       super__Vector_base<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>
                                       )._M_impl.super__Vector_impl_data._M_finish -
                                 (long)(asset_output_amount_list->
                                       super__Vector_base<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>
                                       )._M_impl.super__Vector_impl_data._M_start >> 4);
                uVar14 = uVar14 + 1) {
              ConfidentialNonce::ConfidentialNonce(&nonce);
              pCVar4 = (asset_nonce_list->
                       super__Vector_base<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_>
                       )._M_impl.super__Vector_impl_data._M_start;
              if (uVar14 < (ulong)(((long)(asset_nonce_list->
                                          super__Vector_base<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_>
                                          )._M_impl.super__Vector_impl_data._M_finish - (long)pCVar4
                                   ) / 0x28)) {
                ConfidentialNonce::operator=
                          (&nonce,(ConfidentialNonce *)
                                  ((long)&pCVar4->_vptr_ConfidentialNonce + lVar13));
              }
              AddTxOut(this,(Amount *)
                            ((long)&((asset_output_amount_list->
                                     super__Vector_base<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>
                                     )._M_impl.super__Vector_impl_data._M_start)->amount_ + lVar10),
                       &__return_storage_ptr__->asset,
                       (Script *)
                       ((long)&((asset_locking_script_list->
                                super__Vector_base<cfd::core::Script,_std::allocator<cfd::core::Script>_>
                                )._M_impl.super__Vector_impl_data._M_start)->_vptr_Script + lVar11),
                       &nonce);
              ConfidentialNonce::~ConfidentialNonce(&nonce);
              lVar11 = lVar11 + 0x38;
              lVar10 = lVar10 + 0x10;
              lVar13 = lVar13 + 0x28;
            }
          }
        }
        if ((token_output_amount_list->
            super__Vector_base<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>)._M_impl.
            super__Vector_impl_data._M_start !=
            (token_output_amount_list->
            super__Vector_base<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>)._M_impl.
            super__Vector_impl_data._M_finish) {
          iVar7 = Amount::GetSatoshiValue(token_amount);
          if (0 < iVar7) {
            lVar13 = 0;
            lVar11 = 0;
            lVar10 = 0;
            for (uVar14 = 0;
                uVar14 < (ulong)((long)(token_output_amount_list->
                                       super__Vector_base<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>
                                       )._M_impl.super__Vector_impl_data._M_finish -
                                 (long)(token_output_amount_list->
                                       super__Vector_base<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>
                                       )._M_impl.super__Vector_impl_data._M_start >> 4);
                uVar14 = uVar14 + 1) {
              ConfidentialNonce::ConfidentialNonce(&nonce);
              pCVar4 = (token_nonce_list->
                       super__Vector_base<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_>
                       )._M_impl.super__Vector_impl_data._M_start;
              if (uVar14 < (ulong)(((long)(token_nonce_list->
                                          super__Vector_base<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_>
                                          )._M_impl.super__Vector_impl_data._M_finish - (long)pCVar4
                                   ) / 0x28)) {
                ConfidentialNonce::operator=
                          (&nonce,(ConfidentialNonce *)
                                  ((long)&pCVar4->_vptr_ConfidentialNonce + lVar13));
              }
              AddTxOut(this,(Amount *)
                            ((long)&((token_output_amount_list->
                                     super__Vector_base<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>
                                     )._M_impl.super__Vector_impl_data._M_start)->amount_ + lVar11),
                       &__return_storage_ptr__->token,
                       (Script *)
                       ((long)&((token_locking_script_list->
                                super__Vector_base<cfd::core::Script,_std::allocator<cfd::core::Script>_>
                                )._M_impl.super__Vector_impl_data._M_start)->_vptr_Script + lVar10),
                       &nonce);
              ConfidentialNonce::~ConfidentialNonce(&nonce);
              lVar10 = lVar10 + 0x38;
              lVar11 = lVar11 + 0x10;
              lVar13 = lVar13 + 0x28;
            }
          }
        }
        return __return_storage_ptr__;
      }
      nonce._vptr_ConfidentialNonce = (_func_int **)0x4f4893;
      nonce.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start._0_4_ = 0x760;
      nonce.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = "SetAssetIssuance";
      logger::warn<>((CfdSourceLocation *)&nonce,
                     "Unmatch count. asset amount list and locking script list.");
      pCVar8 = (CfdException *)__cxa_allocate_exception(0x30);
      ::std::__cxx11::string::string
                ((string *)&nonce,"Unmatch count. asset amount list and locking script list.",
                 (allocator *)&total);
      CfdException::CfdException(pCVar8,kCfdIllegalArgumentError,(string *)&nonce);
      __cxa_throw(pCVar8,&CfdException::typeinfo,CfdException::~CfdException);
    }
  }
  else {
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_110);
    ConfidentialValue::~ConfidentialValue((ConfidentialValue *)&nonce);
  }
  nonce._vptr_ConfidentialNonce = (_func_int **)0x4f4893;
  nonce.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x754;
  nonce.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = "SetAssetIssuance";
  logger::warn<>((CfdSourceLocation *)&nonce,"already set to issue parameter");
  pCVar8 = (CfdException *)__cxa_allocate_exception(0x30);
  ::std::__cxx11::string::string
            ((string *)&nonce,"already set to issue parameter",(allocator *)&total);
  CfdException::CfdException(pCVar8,kCfdIllegalArgumentError,(string *)&nonce);
  __cxa_throw(pCVar8,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

IssuanceParameter ConfidentialTransaction::SetAssetIssuance(
    uint32_t tx_in_index, const Amount &asset_amount,
    const std::vector<Amount> &asset_output_amount_list,
    const std::vector<Script> &asset_locking_script_list,
    const std::vector<ConfidentialNonce> &asset_nonce_list,
    const Amount &token_amount,
    const std::vector<Amount> &token_output_amount_list,
    const std::vector<Script> &token_locking_script_list,
    const std::vector<ConfidentialNonce> &token_nonce_list, bool is_blind,
    const ByteData256 &contract_hash) {
  CheckTxInIndex(tx_in_index, __LINE__, __FUNCTION__);

  if ((vin_[tx_in_index].GetInflationKeys().GetData().GetDataSize() > 0) ||
      (vin_[tx_in_index].GetIssuanceAmount().GetData().GetDataSize() > 0)) {
    warn(CFD_LOG_SOURCE, "already set to issue parameter");
    throw CfdException(
        kCfdIllegalArgumentError, "already set to issue parameter");
  }
  if ((asset_amount.GetSatoshiValue() <= 0) &&
      (token_amount.GetSatoshiValue() <= 0)) {
    warn(CFD_LOG_SOURCE, "Issuance must have one non-zero amount.");
    throw CfdException(
        kCfdIllegalArgumentError, "Issuance must have one non-zero amount.");
  }
  if (asset_output_amount_list.empty() != asset_locking_script_list.empty()) {
    warn(
        CFD_LOG_SOURCE,
        "Unmatch count. asset amount list and locking script list.");
    throw CfdException(
        kCfdIllegalArgumentError,
        "Unmatch count. asset amount list and locking script list.");
  }
  if (!asset_output_amount_list.empty()) {
    Amount total;
    for (const auto &amount : asset_output_amount_list) {
      total += amount;
    }
    if (total != asset_amount) {
      warn(CFD_LOG_SOURCE, "Unmatch asset amount.");
      throw CfdException(kCfdIllegalArgumentError, "Unmatch asset amount.");
    }
    for (const auto &script : asset_locking_script_list) {
      if (script.IsEmpty()) {
        warn(CFD_LOG_SOURCE, "Empty locking script from asset.");
        throw CfdException(
            kCfdIllegalArgumentError, "Empty locking script from asset.");
      }
    }
  }
  if (token_output_amount_list.empty() != token_locking_script_list.empty()) {
    warn(
        CFD_LOG_SOURCE,
        "Unmatch count. token amount list and locking script list.");
    throw CfdException(
        kCfdIllegalArgumentError,
        "Unmatch count. token amount list and locking script list.");
  }
  if (!token_output_amount_list.empty()) {
    Amount total;
    for (const auto &amount : token_output_amount_list) {
      total += amount;
    }
    if (total != token_amount) {
      warn(CFD_LOG_SOURCE, "Unmatch token amount.");
      throw CfdException(kCfdIllegalArgumentError, "Unmatch token amount.");
    }
    for (const auto &script : token_locking_script_list) {
      if (script.IsEmpty()) {
        warn(CFD_LOG_SOURCE, "Empty locking script from token.");
        throw CfdException(
            kCfdIllegalArgumentError, "Empty locking script from token.");
      }
    }
  }

  IssuanceParameter param = CalculateIssuanceValue(
      vin_[tx_in_index].GetTxid(), vin_[tx_in_index].GetVout(), is_blind,
      contract_hash, ByteData256());
  SetIssuance(
      tx_in_index, ByteData256(), contract_hash,
      ConfidentialValue(asset_amount), ConfidentialValue(token_amount),
      ByteData(), ByteData());

  if ((!asset_output_amount_list.empty()) &&
      (asset_amount.GetSatoshiValue() > 0)) {
    for (size_t index = 0; index < asset_output_amount_list.size(); ++index) {
      ConfidentialNonce nonce;
      if (index < asset_nonce_list.size()) nonce = asset_nonce_list[index];
      AddTxOut(
          asset_output_amount_list[index], param.asset,
          asset_locking_script_list[index], nonce);
    }
  }
  if ((!token_output_amount_list.empty()) &&
      (token_amount.GetSatoshiValue() > 0)) {
    for (size_t index = 0; index < token_output_amount_list.size(); ++index) {
      ConfidentialNonce nonce;
      if (index < token_nonce_list.size()) nonce = token_nonce_list[index];
      AddTxOut(
          token_output_amount_list[index], param.token,
          token_locking_script_list[index], nonce);
    }
  }

  return param;
}